

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

int comparedUnsignedPair(void *a,void *b)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if ((*b <= *a) && (uVar1 = 1, *a <= *b)) {
    uVar1 = 0xffffffff;
    if (*(uint *)((long)b + 4) <= *(uint *)((long)a + 4)) {
      uVar1 = (uint)(*(uint *)((long)b + 4) < *(uint *)((long)a + 4));
    }
  }
  return uVar1;
}

Assistant:

static int comparedUnsignedPair(const void* a, const void* b)
{
  const unsigned int* au = ((const unsigned int*)a);
  const unsigned int* bu = ((const unsigned int*)b);
  if (au[0] < bu[0])
    return -1;
  if (au[0] > bu[0])
    return 1;
  if (au[1] < bu[1])
    return -1;
  if (au[1] > bu[1])
    return 1;
  return 0;
}